

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpContext.cpp
# Opt level: O0

void __thiscall glslang::TPpContext::~TPpContext(TPpContext *this)

{
  bool bVar1;
  TPpContext *this_local;
  
  this->_vptr_TPpContext = (_func_int **)&PTR__TPpContext_010d9588;
  if (this->preamble != (char *)0x0) {
    operator_delete__(this->preamble);
  }
  while (bVar1 = std::
                 vector<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>
                 ::empty(&this->inputStack), ((bVar1 ^ 0xffU) & 1) != 0) {
    popInput(this);
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)&this->strtodStream);
  std::__cxx11::string::~string((string *)&this->currentSourceFile);
  std::
  stack<glslang::TShader::Includer::IncludeResult_*,_std::deque<glslang::TShader::Includer::IncludeResult_*,_std::allocator<glslang::TShader::Includer::IncludeResult_*>_>_>
  ::~stack(&this->includeStack);
  std::__cxx11::string::~string((string *)&this->rootFileName);
  std::vector<glslang::TPpContext::tInput_*,_std::allocator<glslang::TPpContext::tInput_*>_>::
  ~vector(&this->inputStack);
  std::vector<glslang::TSourceLoc,_std::allocator<glslang::TSourceLoc>_>::~vector
            (&this->lastLineTokenLocs);
  std::vector<int,_std::allocator<int>_>::~vector(&this->lastLineTokens);
  TStringAtomMap::~TStringAtomMap(&this->atomStrings);
  TMap<int,_glslang::TPpContext::MacroSymbol,_std::less<int>_>::~TMap(&this->macroDefs);
  return;
}

Assistant:

TPpContext::~TPpContext()
{
    delete [] preamble;

    // free up the inputStack
    while (! inputStack.empty())
        popInput();
}